

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::LowerBailOnInvalidatedArrayHeadSegment(Lowerer *this,Instr *instr,bool isInHelperBlock)

{
  OpCode OVar1;
  Func *func;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  RegOpnd *opnd;
  StackSym *pSVar7;
  IndirOpnd *src;
  Instr *pIVar8;
  LabelInstr *target;
  Instr *this_01;
  RegOpnd *pRVar9;
  LowererMD *this_02;
  RegOpnd *pRVar10;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd;
  AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
  AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  RegOpnd *pRStack_38;
  ValueType baseValueType;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3415,"(instr)","instr");
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((1 < OVar1 - 0x203) && (OVar1 != StElemI_A)) && (OVar1 != StElemI_A_Strict)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3416,
                       "(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy)"
                       ,
                       "instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy"
                      );
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3417,"(instr->GetDst())","instr->GetDst()");
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  OVar4 = IR::Opnd::GetKind(instr->m_dst);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3418,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  func = instr->m_func;
  this_00 = instr->m_dst;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  pRVar9 = (RegOpnd *)this_00[1]._vptr_Opnd;
  local_3a = (pRVar9->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsNotArrayOrObjectWithArray((ValueType *)&local_3a.field_0);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x341e,"(!baseValueType.IsNotArrayOrObjectWithArray())",
                       "!baseValueType.IsNotArrayOrObjectWithArray()");
    if (!bVar3) goto LAB_005d804c;
    *puVar6 = 0;
  }
  bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_3a.field_0);
  bVar5 = IR::RegOpnd::IsArrayRegOpnd(pRVar9);
  if (bVar5) {
    bVar5 = IR::RegOpnd::IsArrayRegOpnd(pRVar9);
    pRVar10 = pRVar9;
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
      if (!bVar5) {
LAB_005d804c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    pRVar10 = (RegOpnd *)0x0;
  }
  autoReuseInvalidatedHeadSegmentOpnd.autoDelete = false;
  autoReuseInvalidatedHeadSegmentOpnd.wasInUse = false;
  autoReuseInvalidatedHeadSegmentOpnd._18_6_ = 0;
  autoReuseHeadSegmentBeforeHelperCallOpnd.func._1_1_ = 1;
  bVar5 = pRVar10 == (RegOpnd *)0x0;
  if ((!bVar3 || bVar5) ||
     (pSVar7 = (StackSym *)pRVar10[1].super_Opnd._vptr_Opnd, pSVar7 == (StackSym *)0x0)) {
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)pRVar9);
    pIVar8 = IR::Instr::New(Call,func);
    pSVar7 = StackSym::New(TyUint64,func);
    pRStack_38 = IR::RegOpnd::New(pSVar7,TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete,
               &pRStack_38->super_Opnd,func,true);
    IR::Instr::SetDst(pIVar8,&pRStack_38->super_Opnd);
    IR::Instr::InsertBefore(instr,pIVar8);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,pIVar8,
               HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray,(LabelInstr *)0x0,
               (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  }
  else {
    pRStack_38 = IR::RegOpnd::New(pSVar7,TyUint64,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete,
               &pRStack_38->super_Opnd,func,true);
  }
  autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete = false;
  autoReuseHeadSegmentBeforeHelperCallOpnd.wasInUse = false;
  autoReuseHeadSegmentBeforeHelperCallOpnd._18_6_ = 0;
  if ((!bVar3 || bVar5) ||
     (pSVar7 = *(StackSym **)&pRVar10[1].super_Opnd.m_valueType, pSVar7 == (StackSym *)0x0)) {
    pSVar7 = StackSym::New(TyUint32,func);
    opnd = IR::RegOpnd::New(pSVar7,TyUint32,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete,
               &opnd->super_Opnd,func,true);
    if ((!bVar3 || bVar5) || (pRVar10[1].super_Opnd._vptr_Opnd == (_func_int **)0x0)) {
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRStack_38->super_Opnd);
      pIVar8 = IR::Instr::New(Call,func);
      IR::Instr::SetDst(pIVar8,&opnd->super_Opnd);
      IR::Instr::InsertBefore(instr,pIVar8);
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,pIVar8,HelperArray_Jit_GetArrayHeadSegmentLength,
                 (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    }
    else {
      src = IR::IndirOpnd::New(pRStack_38,4,TyUint32,func,false);
      InsertMove(&opnd->super_Opnd,&src->super_Opnd,instr,true);
    }
  }
  else {
    opnd = IR::RegOpnd::New(pSVar7,TyUint32,func);
    IR::AutoReuseOpnd::Initialize
              ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete,
               &opnd->super_Opnd,func,true);
  }
  target = IR::Instr::GetOrCreateContinueLabel(instr,isInHelperBlock);
  LowerOneBailOutKind(this,instr,BailOutOnInvalidatedArrayHeadSegment,false,false);
  pIVar8 = instr->m_next;
  this_02 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_02,pIVar8,(Opnd *)pRVar9);
  LowererMD::LoadHelperArgument(this_02,pIVar8,&opnd->super_Opnd);
  LowererMD::LoadHelperArgument(this_02,pIVar8,&pRStack_38->super_Opnd);
  this_01 = IR::Instr::New(Call,func);
  pRVar9 = IR::RegOpnd::New(TyUint8,func);
  local_a8 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_a8,&pRVar9->super_Opnd,func,true);
  IR::Instr::SetDst(this_01,&pRVar9->super_Opnd);
  IR::Instr::InsertBefore(pIVar8,this_01);
  LowererMD::ChangeToHelperCall
            (this_02,this_01,HelperArray_Jit_OperationInvalidatedArrayHeadSegment,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  InsertTest(&pRVar9->super_Opnd,&pRVar9->super_Opnd,pIVar8);
  InsertBranch(BrEq_A,false,target,pIVar8);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseHeadSegmentBeforeHelperCallOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseInvalidatedHeadSegmentOpnd.autoDelete);
  return;
}

Assistant:

void Lowerer::LowerBailOnInvalidatedArrayHeadSegment(IR::Instr *const instr, const bool isInHelperBlock)
{
    /*
        // Generate checks for whether the head segment or the head segment length changed during the helper call

        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym()))
        {
            // Record the array head segment before the helper call
            headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        }
        if(!(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentLengthSym()))
        {
            // Record the array head segment length before the helper call
            if(baseValueType.IsArrayOrObjectWithArray() && arrayOpnd && arrayOpnd.HeadSegmentSym())
            {
                mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            }
            else
            {
                headSegmentLengthBeforeHelperCall =
                    Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            }
        }

        helperCall:
            (Helper call and other bailout checks)

        // If the array has a different head segment or head segment length after the helper call, then this store needs to bail
        // out
        invalidatedHeadSegment =
            JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
                headSegmentBeforeHelperCall,
                headSegmentLengthBeforeHelperCall,
                base)
        test invalidatedHeadSegment, invalidatedHeadSegment
        jz $skipBailOut

        (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)

        $skipBailOut:
    */

    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict || instr->m_opcode == Js::OpCode::Memset || instr->m_opcode == Js::OpCode::Memcopy);
    Assert(instr->GetDst());
    Assert(instr->GetDst()->IsIndirOpnd());

    Func *const func = instr->m_func;

    IR::RegOpnd *const baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    const ValueType baseValueType(baseOpnd->GetValueType());
    Assert(!baseValueType.IsNotArrayOrObjectWithArray());
    const bool isArrayOrObjectWithArray = baseValueType.IsArrayOrObjectWithArray();
    IR::ArrayRegOpnd *const arrayOpnd = baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd() : nullptr;

    IR::RegOpnd *headSegmentBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
    {
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentSym(), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
    }
    else
    {
        // Record the array head segment before the helper call
        //     headSegmentBeforeHelperCall = Js::JavascriptArray::Jit_GetArrayHeadSegmentForArrayOrObjectWithArray(base)
        m_lowererMD.LoadHelperArgument(instr, baseOpnd);
        IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
        headSegmentBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
        autoReuseHeadSegmentBeforeHelperCallOpnd.Initialize(headSegmentBeforeHelperCallOpnd, func);
        callInstr->SetDst(headSegmentBeforeHelperCallOpnd);
        instr->InsertBefore(callInstr);
        m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentForArrayOrObjectWithArray);
    }

    IR::RegOpnd *headSegmentLengthBeforeHelperCallOpnd;
    IR::AutoReuseOpnd autoReuseHeadSegmentLengthBeforeHelperCallOpnd;
    if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentLengthSym())
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(arrayOpnd->HeadSegmentLengthSym(), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
    }
    else
    {
        headSegmentLengthBeforeHelperCallOpnd = IR::RegOpnd::New(StackSym::New(TyUint32, func), TyUint32, func);
        autoReuseHeadSegmentLengthBeforeHelperCallOpnd.Initialize(headSegmentLengthBeforeHelperCallOpnd, func);
        if(isArrayOrObjectWithArray && arrayOpnd && arrayOpnd->HeadSegmentSym())
        {
            // Record the array head segment length before the helper call
            //     mov headSegmentLengthBeforeHelperCall, [headSegmentBeforeHelperCall + offsetOf(length)]
            InsertMove(
                headSegmentLengthBeforeHelperCallOpnd,
                IR::IndirOpnd::New(
                    headSegmentBeforeHelperCallOpnd,
                    Js::SparseArraySegmentBase::GetOffsetOfLength(),
                    TyUint32,
                    func),
                instr);
        }
        else
        {
            // Record the array head segment length before the helper call
            //     headSegmentLengthBeforeHelperCall =
            //         Js::JavascriptArray::Jit_GetArrayHeadSegmentLength(headSegmentBeforeHelperCall)
            m_lowererMD.LoadHelperArgument(instr, headSegmentBeforeHelperCallOpnd);
            IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
            callInstr->SetDst(headSegmentLengthBeforeHelperCallOpnd);
            instr->InsertBefore(callInstr);
            m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_GetArrayHeadSegmentLength);
        }
    }

    IR::LabelInstr *const skipBailOutLabel = instr->GetOrCreateContinueLabel(isInHelperBlock);
    LowerOneBailOutKind(instr, IR::BailOutOnInvalidatedArrayHeadSegment, isInHelperBlock);
    IR::Instr *const insertBeforeInstr = instr->m_next;

    // If the array has a different head segment or head segment length after the helper call, then this store needs to bail out
    //     invalidatedHeadSegment =
    //         JavascriptArray::Jit_OperationInvalidatedArrayHeadSegment(
    //             headSegmentBeforeHelperCall,
    //             headSegmentLengthBeforeHelperCall,
    //             base)
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, baseOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentLengthBeforeHelperCallOpnd);
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, headSegmentBeforeHelperCallOpnd);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    IR::RegOpnd *const invalidatedHeadSegmentOpnd = IR::RegOpnd::New(TyUint8, func);
    const IR::AutoReuseOpnd autoReuseInvalidatedHeadSegmentOpnd(invalidatedHeadSegmentOpnd, func);
    callInstr->SetDst(invalidatedHeadSegmentOpnd);
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.ChangeToHelperCall(callInstr, IR::HelperArray_Jit_OperationInvalidatedArrayHeadSegment);

    //     test invalidatedHeadSegment, invalidatedHeadSegment
    //     jz $skipBailOut
    InsertTestBranch(
        invalidatedHeadSegmentOpnd,
        invalidatedHeadSegmentOpnd,
        Js::OpCode::BrEq_A,
        skipBailOutLabel,
        insertBeforeInstr);

    //     (Bail out with IR::BailOutOnInvalidatedArrayHeadSegment)
    //     $skipBailOut:
}